

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O3

GLuint gl4cts::CopyImage::getPixelSizeForCompatibilityVerification(GLenum internal_format)

{
  GLuint GVar1;
  
  GVar1 = Utils::getPixelSizeForFormat(internal_format);
  if (internal_format == 0x8055) {
    GVar1 = 1;
  }
  return GVar1;
}

Assistant:

GLuint getPixelSizeForCompatibilityVerification(GLenum internal_format)
{
	GLuint size = Utils::getPixelSizeForFormat(internal_format);

	switch (internal_format)
	{
	case GL_RGBA2:
		size = 1;
		break;
	default:
		break;
	}

	return size;
}